

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O3

int Routing::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  long lVar2;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x40);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Target","",0.0,15.0,0.0,1.0,1.0,0,
                    "Specifies the output that the input signal is routed to. This can be read by scripts via RoutingDemo_GetData"
                   );
  lVar2 = 4;
  do {
    *(undefined4 *)((long)&buffer + lVar2) = 0;
    *(undefined4 *)(bufferchannels + lVar2 + 0x3c) = 0;
    lVar2 = lVar2 + 0x40008;
  } while (lVar2 != 0x400084);
  return 1;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Target", "", 0.0f, MAXINDEX - 1, 0.0f, 1.0f, 1.0f, P_TARGET, "Specifies the output that the input signal is routed to. This can be read by scripts via RoutingDemo_GetData");
        for (int i = 0; i < MAXINDEX; i++)
            buffer[i].Clear();
        return numparams;
    }